

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testIncrWithTags_Test::~Engine_testIncrWithTags_Test(Engine_testIncrWithTags_Test *this)

{
  testing::Test::~Test((Test *)0x13014e);
  return;
}

Assistant:

TEST(Engine, testIncrWithTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Incr("foo", Tag("Hello", "World"), Tag("Another", "Tag"));
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->intMeasures.size());
    auto im = th->intMeasures[0];
    ASSERT_EQ("test.foo", im.name);
    ASSERT_EQ(MetricType::Counter, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(1, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Hello", im.tags[0].name);
    ASSERT_EQ("World", im.tags[0].value);
    ASSERT_EQ("Another", im.tags[1].name);
    ASSERT_EQ("Tag", im.tags[1].value);
}